

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointstepper.c
# Opt level: O0

SUNErrCode SUNAdjointStepper_Destroy(SUNAdjointStepper *self_ptr)

{
  undefined8 *in_RDI;
  SUNAdjointStepper self;
  SUNStepper *stepper_ptr;
  
  stepper_ptr = (SUNStepper *)*in_RDI;
  if (*(int *)((long)stepper_ptr + 0x24) != 0) {
    SUNStepper_Destroy(stepper_ptr);
  }
  if (*(int *)(stepper_ptr + 4) != 0) {
    SUNStepper_Destroy(stepper_ptr);
  }
  free(stepper_ptr);
  *in_RDI = 0;
  return 0;
}

Assistant:

SUNErrCode SUNAdjointStepper_Destroy(SUNAdjointStepper* self_ptr)
{
  SUNAdjointStepper self = *self_ptr;
  if (self->own_fwd_sunstepper) { SUNStepper_Destroy(&self->fwd_sunstepper); }
  if (self->own_adj_sunstepper) { SUNStepper_Destroy(&self->adj_sunstepper); }
  free(self);
  *self_ptr = NULL;
  return SUN_SUCCESS;
}